

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O0

bool __thiscall
vkt::texture::SampleVerifier::verifySampleTexelGridCoords
          (SampleVerifier *this,SampleArguments *args,Vec4 *result,IVec3 *gridCoordHi,
          IVec3 *gridCoordLo,Vec2 *lodBounds,int level,VkSamplerMipmapMode mipmapFilter,
          ostream *report)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  ostream *poVar4;
  double dVar5;
  Vector<int,_3> *local_150;
  Vector<int,_3> *local_138;
  int local_12c;
  undefined1 local_120 [8];
  Vec4 idealMax_1;
  Vec4 idealMin_1;
  Vector<float,_2> local_f8;
  Vec2 local_f0;
  Vec2 lodFracBounds;
  undefined1 local_e0 [8];
  Vec4 idealMax;
  Vec4 idealMin;
  undefined1 local_b8 [2];
  bool canBeMagnified;
  bool canBeMinified;
  int levelNdx;
  IVec3 texelGridOffset [2];
  undefined1 local_98 [8];
  IVec3 baseTexel [2];
  undefined1 local_78 [8];
  IVec3 gridCoord [2];
  int layer;
  Vec2 *lodBounds_local;
  IVec3 *gridCoordLo_local;
  IVec3 *gridCoordHi_local;
  Vec4 *result_local;
  SampleArguments *args_local;
  SampleVerifier *this_local;
  
  if ((this->m_imParams->isArrayed & 1U) == 0) {
    local_12c = 0;
  }
  else {
    dVar5 = deRoundEven((double)args->layer);
    local_12c = (int)dVar5;
  }
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)local_78,gridCoordHi);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(gridCoord[0].m_data + 1),gridCoordLo);
  local_138 = (Vector<int,_3> *)local_98;
  do {
    tcu::Vector<int,_3>::Vector(local_138);
    local_138 = local_138 + 1;
  } while (local_138 != (Vector<int,_3> *)(baseTexel[1].m_data + 1));
  local_150 = (Vector<int,_3> *)local_b8;
  do {
    tcu::Vector<int,_3>::Vector(local_150);
    local_150 = local_150 + 1;
  } while (local_150 != (Vector<int,_3> *)(texelGridOffset[1].m_data + 1));
  for (idealMin.m_data[3] = 0.0; (int)idealMin.m_data[3] < 2;
      idealMin.m_data[3] = (float)((int)idealMin.m_data[3] + 1)) {
    util::calcTexelBaseOffset
              ((IVec3 *)(gridCoord[(long)(int)idealMin.m_data[3] + -1].m_data + 1),this->m_coordBits
               ,(IVec3 *)(baseTexel[(long)(int)idealMin.m_data[3] + -1].m_data + 1),
               (IVec3 *)(local_b8 + (long)(int)idealMin.m_data[3] * 0xc));
  }
  pfVar3 = tcu::Vector<float,_2>::operator[](lodBounds,1);
  fVar1 = *pfVar3;
  pfVar3 = tcu::Vector<float,_2>::operator[](lodBounds,0);
  if (*pfVar3 <= 0.0) {
    std::operator<<(report,"Trying magnification...\n");
    if (this->m_samplerParams->magFilter == VK_FILTER_NEAREST) {
      poVar4 = std::operator<<(report,"Testing against nearest texel at ");
      poVar4 = tcu::operator<<(poVar4,(Vector<int,_3> *)local_98);
      std::operator<<(poVar4,"\n");
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(idealMax.m_data + 2));
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_e0);
      fetchTexel(this,(IVec3 *)local_98,local_12c,level,VK_FILTER_NEAREST,
                 (Vec4 *)(idealMax.m_data + 2),(Vec4 *)local_e0);
      bVar2 = util::isInRange<4>(result,(Vector<float,_4> *)(idealMax.m_data + 2),
                                 (Vector<float,_4> *)local_e0);
      if (bVar2) {
        return true;
      }
      poVar4 = std::operator<<(report,"Failed against ");
      poVar4 = tcu::operator<<(poVar4,(Vector<float,_4> *)(idealMax.m_data + 2));
      poVar4 = std::operator<<(poVar4," through ");
      poVar4 = tcu::operator<<(poVar4,(Vector<float,_4> *)local_e0);
      std::operator<<(poVar4,"\n");
    }
    else {
      tcu::Vector<float,_2>::Vector(&lodFracBounds,0.0,0.0);
      bVar2 = verifySampleFiltered
                        (this,result,(IVec3 *)local_98,(IVec3 *)(baseTexel[0].m_data + 1),
                         (IVec3 *)local_b8,(IVec3 *)(texelGridOffset[0].m_data + 1),local_12c,level,
                         &lodFracBounds,VK_FILTER_LINEAR,VK_SAMPLER_MIPMAP_MODE_NEAREST,report);
      if (bVar2) {
        return true;
      }
    }
  }
  if (0.0 < fVar1) {
    std::operator<<(report,"Trying minification...\n");
    if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR) {
      tcu::Vector<float,_2>::Vector(&local_f8,(float)level);
      tcu::operator-((tcu *)&local_f0,lodBounds,&local_f8);
      bVar2 = verifySampleFiltered
                        (this,result,(IVec3 *)local_98,(IVec3 *)(baseTexel[0].m_data + 1),
                         (IVec3 *)local_b8,(IVec3 *)(texelGridOffset[0].m_data + 1),local_12c,level,
                         &local_f0,this->m_samplerParams->minFilter,VK_SAMPLER_MIPMAP_MODE_LINEAR,
                         report);
      if (bVar2) {
        return true;
      }
    }
    else if (this->m_samplerParams->minFilter == VK_FILTER_LINEAR) {
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(idealMin_1.m_data + 2),0.0,0.0);
      bVar2 = verifySampleFiltered
                        (this,result,(IVec3 *)local_98,(IVec3 *)(baseTexel[0].m_data + 1),
                         (IVec3 *)local_b8,(IVec3 *)(texelGridOffset[0].m_data + 1),local_12c,level,
                         (Vec2 *)(idealMin_1.m_data + 2),VK_FILTER_LINEAR,
                         VK_SAMPLER_MIPMAP_MODE_NEAREST,report);
      if (bVar2) {
        return true;
      }
    }
    else {
      poVar4 = std::operator<<(report,"Testing against nearest texel at ");
      poVar4 = tcu::operator<<(poVar4,(Vector<int,_3> *)local_98);
      std::operator<<(poVar4,"\n");
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(idealMax_1.m_data + 2));
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_120);
      fetchTexel(this,(IVec3 *)local_98,local_12c,level,VK_FILTER_NEAREST,
                 (Vec4 *)(idealMax_1.m_data + 2),(Vec4 *)local_120);
      bVar2 = util::isInRange<4>(result,(Vector<float,_4> *)(idealMax_1.m_data + 2),
                                 (Vector<float,_4> *)local_120);
      if (bVar2) {
        return true;
      }
      poVar4 = std::operator<<(report,"Failed against ");
      poVar4 = tcu::operator<<(poVar4,(Vector<float,_4> *)(idealMax_1.m_data + 2));
      poVar4 = std::operator<<(poVar4," through ");
      poVar4 = tcu::operator<<(poVar4,(Vector<float,_4> *)local_120);
      std::operator<<(poVar4,"\n");
    }
  }
  return false;
}

Assistant:

bool SampleVerifier::verifySampleTexelGridCoords (const SampleArguments&	args,
												  const Vec4&				result,
												  const IVec3&				gridCoordHi,
												  const IVec3&				gridCoordLo,
												  const Vec2&				lodBounds,
												  int						level,
												  VkSamplerMipmapMode		mipmapFilter,
												  std::ostream&				report) const
{
	const int	layer		 = m_imParams.isArrayed ? (int)deRoundEven(args.layer) : 0U;
	const IVec3 gridCoord[2] = {gridCoordHi, gridCoordLo};

	IVec3 baseTexel[2];
	IVec3 texelGridOffset[2];

    for (int levelNdx = 0; levelNdx < 2; ++levelNdx)
	{
		calcTexelBaseOffset(gridCoord[levelNdx], m_coordBits, baseTexel[levelNdx], texelGridOffset[levelNdx]);
	}

	const bool	canBeMinified  = lodBounds[1] > 0.0f;
	const bool	canBeMagnified = lodBounds[0] <= 0.0f;

	if (canBeMagnified)
	{
		report << "Trying magnification...\n";

		if (m_samplerParams.magFilter == VK_FILTER_NEAREST)
		{
			report << "Testing against nearest texel at " << baseTexel[0] << "\n";

			Vec4 idealMin;
			Vec4 idealMax;

			fetchTexel(baseTexel[0], layer, level, VK_FILTER_NEAREST, idealMin, idealMax);

			if (isInRange(result, idealMin, idealMax))
		    {
				return true;
			}
			else
			{
				report << "Failed against " << idealMin << " through " << idealMax << "\n";
			}
		}
		else
		{
			if  (verifySampleFiltered(result, baseTexel[0], baseTexel[1], texelGridOffset[0], texelGridOffset[1], layer, level, Vec2(0.0f, 0.0f), VK_FILTER_LINEAR, VK_SAMPLER_MIPMAP_MODE_NEAREST, report))
				return true;
		}
	}

	if (canBeMinified)
	{
		report << "Trying minification...\n";

		if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR)
		{
			const Vec2 lodFracBounds = lodBounds - Vec2((float)level);

			if (verifySampleFiltered(result, baseTexel[0], baseTexel[1], texelGridOffset[0], texelGridOffset[1], layer, level, lodFracBounds, m_samplerParams.minFilter, VK_SAMPLER_MIPMAP_MODE_LINEAR, report))
				return true;
		}
		else if (m_samplerParams.minFilter == VK_FILTER_LINEAR)
		{
		    if (verifySampleFiltered(result, baseTexel[0], baseTexel[1], texelGridOffset[0], texelGridOffset[1], layer, level, Vec2(0.0f, 0.0f), VK_FILTER_LINEAR, VK_SAMPLER_MIPMAP_MODE_NEAREST, report))
				return true;
		}
		else
		{
			report << "Testing against nearest texel at " << baseTexel[0] << "\n";

			Vec4 idealMin;
			Vec4 idealMax;

		    fetchTexel(baseTexel[0], layer, level, VK_FILTER_NEAREST, idealMin, idealMax);

			if (isInRange(result, idealMin, idealMax))
		    {
				return true;
			}
			else
			{
				report << "Failed against " << idealMin << " through " << idealMax << "\n";
			}
		}
	}

	return false;
}